

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

string * __thiscall
libcellml::ComponentEntity::encapsulationId_abi_cxx11_
          (string *__return_storage_ptr__,ComponentEntity *this)

{
  ComponentEntityImpl *pCVar1;
  ComponentEntity *this_local;
  
  pCVar1 = pFunc(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pCVar1->mEncapsulationId)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string ComponentEntity::encapsulationId() const
{
    return pFunc()->mEncapsulationId;
}